

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void NodeRegisterClassEx(nodemodule *Module,nodemeta *Meta)

{
  nodemeta *pnVar1;
  fourcc_t ClassId;
  nodecontext *p;
  nodeclass *pnVar2;
  nodeclass *Class;
  fourcc_t ClassId_00;
  size_t VMTSize;
  
  if (Module == (nodemodule *)0x0) {
    __assert_fail("(const void*)(Module)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x550,"void NodeRegisterClassEx(nodemodule *, const nodemeta *)");
  }
  p = *(Module->Base).VMT;
LAB_001258b0:
  if (*(char *)Meta != '\x01') {
    return;
  }
  ClassId_00 = (fourcc_t)Meta->Data;
  if (ClassId_00 == 0) {
    ClassId_00 = p->DynamicClass + 1;
    p->DynamicClass = ClassId_00;
  }
  pnVar1 = Meta + 1;
  Meta = Meta + 2;
  VMTSize = 0x48;
  do {
    if (*(char *)(Meta + -1) == '\x0f') {
      VMTSize = Meta[-1].Data;
    }
    else if (*(char *)(Meta + -1) == '\0') break;
    Meta = Meta + 1;
  } while( true );
  ClassId = (fourcc_t)Meta[-1].Data;
  pnVar2 = NodeContext_FindClassEx(p,ClassId,Module);
  if (pnVar2 != (nodeclass *)0x0 && VMTSize == 0x48) {
    VMTSize = pnVar2->VMTSize;
  }
  Class = NodeContext_CreateClass(p,ClassId_00,VMTSize,Module);
  if (Class != (nodeclass *)0x0) {
    Class->Meta = pnVar1;
    Class->ParentId = ClassId;
    Class->ParentClass = pnVar2;
    InitClass(p,Class);
  }
  if (*(uint *)(Meta + -1) < 0x100) {
    return;
  }
  goto LAB_001258b0;
}

Assistant:

void NodeRegisterClassEx(nodemodule* Module,const nodemeta* Meta)
{
    nodeclass* Class;
    nodecontext* p = Node_Context(Module);

    while (Meta->Meta == META_CLASS_CLASS_ID)
    {
        const nodeclass* ParentClass;
        fourcc_t ParentId;
        fourcc_t ClassId = (fourcc_t)(Meta++)->Data;
        size_t VMTSize = DEFAULT_VMT;
        const nodemeta* i = Meta;

        if (!ClassId)
            ClassId = ++p->DynamicClass;

        for (;Meta->Meta != META_CLASS_PARENT_ID;++Meta)
            if (Meta->Meta == META_CLASS_VMT_SIZE)
                VMTSize = (size_t)(Meta->Data);

        ParentId = (fourcc_t)Meta->Data;
        ParentClass = NodeContext_FindClassEx(p,ParentId,Module);

        if (VMTSize == DEFAULT_VMT && ParentClass)
            VMTSize = ParentClass->VMTSize;

        Class = NodeContext_CreateClass(p,ClassId,VMTSize,Module);
        if (Class)
        {
            Class->Meta = i;
            Class->ParentId = ParentId;
            Class->ParentClass = ParentClass;
            InitClass(p,Class);
        }

        if (!(Meta++)->Id) // more classes?
            break;
    }
}